

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink7.c
# Opt level: O2

Vec_Wrd_t * Unm_ManComputeTruths(Unm_Man_t *p)

{
  Gia_Man_t *p_00;
  int iVar1;
  int iVar2;
  Vec_Wrd_t *pVVar3;
  Vec_Wrd_t *vTruths;
  int *piVar4;
  Gia_Obj_t *pObj;
  word wVar5;
  word *__ptr;
  int i;
  long lVar6;
  ulong uVar7;
  Vec_Wrd_t *vTruthsTemp;
  
  pVVar3 = Vec_WrdAlloc(p->vUsed->nSize);
  iVar1 = p->pGia->nObjs;
  vTruths = Vec_WrdAlloc(iVar1);
  vTruths->nSize = iVar1;
  i = 0;
  memset(vTruths->pArray,0,(long)iVar1 << 3);
  vTruthsTemp = vTruths;
  while( true ) {
    if (p->vUsed->nSize <= i) {
      Vec_WrdFreeP(&vTruthsTemp);
      return pVVar3;
    }
    iVar1 = Vec_IntEntry(p->vUsed,i);
    iVar2 = Gia_ObjIsLut(p->pGia,iVar1);
    if (iVar2 == 0) break;
    p->vLeaves->nSize = 0;
    lVar6 = 0;
    while( true ) {
      iVar2 = Gia_ObjLutSize(p->pGia,iVar1);
      if (iVar2 <= lVar6) break;
      piVar4 = Gia_ObjLutFanins(p->pGia,iVar1);
      Vec_IntPush(p->vLeaves,piVar4[lVar6]);
      lVar6 = lVar6 + 1;
    }
    if (6 < p->vLeaves->nSize) {
      __assert_fail("Vec_IntSize(p->vLeaves) <= 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaShrink7.c"
                    ,0xec,"Vec_Wrd_t *Unm_ManComputeTruths(Unm_Man_t *)");
    }
    p_00 = p->pGia;
    pObj = Gia_ManObj(p_00,iVar1);
    wVar5 = Shr_ManComputeTruth6(p_00,pObj,p->vLeaves,vTruths);
    iVar1 = pVVar3->nSize;
    if (iVar1 == pVVar3->nCap) {
      uVar7 = (ulong)(uint)(iVar1 * 2);
      if (iVar1 < 0x10) {
        uVar7 = 0x10;
      }
      __ptr = pVVar3->pArray;
      if (iVar1 < (int)uVar7) {
        if (__ptr == (word *)0x0) {
          __ptr = (word *)malloc(uVar7 << 3);
        }
        else {
          __ptr = (word *)realloc(__ptr,uVar7 << 3);
        }
        pVVar3->pArray = __ptr;
        if (__ptr == (word *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                        ,0x1e4,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
        }
        pVVar3->nCap = (int)uVar7;
      }
    }
    else {
      __ptr = pVVar3->pArray;
    }
    pVVar3->nSize = iVar1 + 1;
    __ptr[iVar1] = wVar5;
    i = i + 1;
  }
  __assert_fail("Gia_ObjIsLut(p->pGia, iObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaShrink7.c"
                ,0xe7,"Vec_Wrd_t *Unm_ManComputeTruths(Unm_Man_t *)");
}

Assistant:

Vec_Wrd_t * Unm_ManComputeTruths( Unm_Man_t * p )
{
    Vec_Wrd_t * vTruthsTemp, * vTruths;
    int i, k, iObj, iNode;
    word uTruth;
    vTruths = Vec_WrdAlloc( Vec_IntSize(p->vUsed) );
    vTruthsTemp = Vec_WrdStart( Gia_ManObjNum(p->pGia) );
    Vec_IntForEachEntry( p->vUsed, iObj, i )
    {
        assert( Gia_ObjIsLut(p->pGia, iObj) );
        // collect leaves of this gate  
        Vec_IntClear( p->vLeaves );
        Gia_LutForEachFanin( p->pGia, iObj, iNode, k )
            Vec_IntPush( p->vLeaves, iNode );
        assert( Vec_IntSize(p->vLeaves) <= 6 );
        // compute truth table 
        uTruth = Shr_ManComputeTruth6( p->pGia, Gia_ManObj(p->pGia, iObj), p->vLeaves, vTruthsTemp );
        Vec_WrdPush( vTruths, uTruth );
//        if ( i % 100 == 0 )
//            Kit_DsdPrintFromTruth( (unsigned *)&uTruth, 6 ), printf( "\n" );
    }
    Vec_WrdFreeP( &vTruthsTemp );
    return vTruths;
}